

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O3

Rgba __thiscall EnvmapImage::filteredLookup(EnvmapImage *this,V3f *d,float r,int n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  char cVar7;
  Rgba RVar8;
  uint uVar9;
  uint uVar10;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  code *pcVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  Vec3<float> local_100;
  float local_f4;
  V3f *local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_cc;
  float local_c8;
  float local_c4;
  EnvmapImage *local_c0;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  ulong local_70;
  ulong local_68;
  Box2i *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  V2f local_38;
  ulong uVar11;
  
  pcVar16 = anon_unknown.dwarf_8226::dirToPosCube;
  if (this->_type == ENVMAP_LATLONG) {
    pcVar16 = anon_unknown.dwarf_8226::dirToPosLatLong;
  }
  fVar23 = d->x;
  fVar17 = d->z * d->z + fVar23 * fVar23 + d->y * d->y;
  local_e8 = r;
  local_f0 = d;
  if (fVar17 < 2.3509887e-38) {
    fVar17 = Imath_3_2::Vec3<float>::lengthTiny(d);
    fVar23 = local_f0->x;
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  uVar11 = (ulong)(uint)fVar23;
  if ((fVar17 != 0.0) || (NAN(fVar17))) {
    auVar18._4_4_ = local_f0->y;
    auVar18._0_4_ = fVar23;
    auVar18._8_8_ = 0;
    auVar19._4_4_ = fVar17;
    auVar19._0_4_ = fVar17;
    auVar19._8_4_ = fVar17;
    auVar19._12_4_ = fVar17;
    auVar19 = divps(auVar18,auVar19);
    uVar11 = auVar19._0_8_;
    local_f0->x = (float)(int)uVar11;
    local_f0->y = (float)(int)(uVar11 >> 0x20);
    local_f0->z = local_f0->z / fVar17;
  }
  local_100.z = (float)uVar11;
  if (ABS(local_100.z) <= 0.707) {
    local_100.y = local_f0->z - local_100.z * 0.0;
    local_100.z = local_100.z * 0.0 - local_f0->y;
    local_100.x = local_f0->y * 0.0 + local_f0->z * -0.0;
    fVar23 = local_100.z * local_100.z + local_100.x * local_100.x + local_100.y * local_100.y;
    if (2.3509887e-38 <= fVar23) {
      fVar23 = SQRT(fVar23);
      goto LAB_001036cf;
    }
  }
  else {
    uVar1 = local_f0->y;
    uVar4 = local_f0->z;
    fVar23 = (float)uVar1 * 0.0 + -(float)uVar4;
    fVar17 = (float)uVar4 * 0.0 + local_100.z * -0.0;
    local_100._0_8_ = CONCAT44(fVar17,fVar23);
    local_100.z = (float)uVar1 * -0.0 + local_100.z;
    fVar23 = local_100.z * local_100.z + fVar23 * fVar23 + fVar17 * fVar17;
    if (2.3509887e-38 <= fVar23) {
      fVar23 = SQRT(fVar23);
      goto LAB_001036cf;
    }
  }
  fVar23 = Imath_3_2::Vec3<float>::lengthTiny(&local_100);
LAB_001036cf:
  local_98._0_4_ = 0.0;
  if ((fVar23 != 0.0) || (NAN(fVar23))) {
    auVar25._8_8_ = 0;
    auVar25._0_4_ = local_100.x;
    auVar25._4_4_ = local_100.y;
    auVar20._4_4_ = fVar23;
    auVar20._0_4_ = fVar23;
    auVar20._8_4_ = fVar23;
    auVar20._12_4_ = fVar23;
    auVar19 = divps(auVar25,auVar20);
    local_98._0_4_ = local_100.z / fVar23;
  }
  else {
    auVar19 = ZEXT816(0);
  }
  local_98._12_4_ = 0;
  local_98._8_4_ = 0;
  local_98._4_4_ = 0;
  local_98._0_4_ = (float)local_98._0_4_ * local_e8;
  local_a8 = auVar19._0_4_ * local_e8;
  fStack_a4 = auVar19._4_4_ * local_e8;
  fStack_a0 = auVar19._8_4_ * local_e8;
  fStack_9c = auVar19._12_4_ * local_e8;
  uVar2 = local_f0->y;
  uVar5 = local_f0->z;
  fVar23 = (float)local_98._0_4_ * (float)uVar2 - fStack_a4 * (float)uVar5;
  fVar17 = local_a8 * (float)uVar5 - (float)local_98._0_4_ * local_f0->x;
  local_100._0_8_ = CONCAT44(fVar17,fVar23);
  local_100.z = fStack_a4 * local_f0->x - (float)uVar2 * local_a8;
  fVar23 = local_100.z * local_100.z + fVar23 * fVar23 + fVar17 * fVar17;
  if (fVar23 < 2.3509887e-38) {
    local_98 = ZEXT416((uint)local_98._0_4_);
    local_88 = local_e8;
    fStack_84 = local_e8;
    fStack_80 = local_e8;
    fStack_7c = local_e8;
    fVar23 = Imath_3_2::Vec3<float>::lengthTiny(&local_100);
    fVar17 = local_88;
    fVar26 = fStack_84;
    fVar27 = fStack_80;
    fVar28 = fStack_7c;
  }
  else {
    fVar23 = SQRT(fVar23);
    fVar17 = local_e8;
    fVar26 = local_e8;
    fVar27 = local_e8;
    fVar28 = local_e8;
  }
  fVar22 = 0.0;
  fStack_e4 = 0.0;
  fStack_e0 = 0.0;
  fStack_dc = 0.0;
  local_88 = 0.0;
  local_f4 = 0.0;
  _local_b8 = ZEXT812(0);
  fStack_ac = 0.0;
  if ((fVar23 != 0.0) || (NAN(fVar23))) {
    auVar24._8_8_ = 0;
    auVar24._0_4_ = local_100.x;
    auVar24._4_4_ = local_100.y;
    auVar21._4_4_ = fVar23;
    auVar21._0_4_ = fVar23;
    auVar21._8_4_ = fVar23;
    auVar21._12_4_ = fVar23;
    _local_b8 = divps(auVar24,auVar21);
    local_f4 = local_100.z / fVar23;
  }
  if (0 < n) {
    local_b8._4_4_ = (float)local_b8._4_4_ * fVar26;
    local_b8._0_4_ = (float)local_b8._0_4_ * fVar17;
    fStack_b0 = fStack_b0 * fVar27;
    fStack_ac = fStack_ac * fVar28;
    local_f4 = local_f4 * local_e8;
    local_cc = (float)(n + 1);
    local_60 = &this->_dataWindow;
    local_68 = 0;
    fVar23 = (float)local_98._0_4_;
    local_c0 = this;
    local_70 = (ulong)(uint)n;
    do {
      fStack_4c = (float)((int)local_68 * 2 + 2) / local_cc + -1.0;
      local_c4 = 1.0 - ABS(fStack_4c);
      local_c8 = local_f4 * fStack_4c;
      local_58 = fStack_4c * (float)local_b8._0_4_;
      fStack_54 = fStack_4c * (float)local_b8._4_4_;
      fStack_50 = fStack_4c * fStack_b0;
      fStack_4c = fStack_4c * fStack_ac;
      iVar12 = 2;
      uVar11 = local_70;
      do {
        fVar17 = (float)iVar12 / local_cc + -1.0;
        local_48 = ZEXT416((uint)(1.0 - ABS(fVar17)));
        local_100.z = fVar23 * fVar17 + local_f0->z + local_c8;
        uVar3 = local_f0->x;
        uVar6 = local_f0->y;
        local_100.y = (float)uVar6 + fVar17 * fStack_a4 + fStack_54;
        local_100.x = (float)uVar3 + fVar17 * local_a8 + local_58;
        local_e8 = fVar22;
        (*pcVar16)(&local_38,local_60,&local_100);
        RVar8 = sample(local_c0,&local_38);
        fVar23 = (float)local_48._0_4_ * local_c4;
        local_88 = local_88 + fVar23;
        fVar22 = local_e8 +
                 fVar23 * *(float *)(_imath_half_to_float_table + ((ulong)RVar8 >> 0x30) * 4);
        fStack_e4 = fStack_e4 +
                    fVar23 * *(float *)(_imath_half_to_float_table +
                                       (ulong)(RVar8._4_4_ & 0xffff) * 4);
        fStack_e0 = fStack_e0 +
                    fVar23 * *(float *)(_imath_half_to_float_table +
                                       (ulong)(RVar8._0_4_ >> 0x10) * 4);
        fStack_dc = fStack_dc +
                    fVar23 * *(float *)(_imath_half_to_float_table +
                                       (ulong)(RVar8._0_4_ & 0xffff) * 4);
        iVar12 = iVar12 + 2;
        uVar10 = (int)uVar11 - 1;
        uVar11 = (ulong)uVar10;
        fVar23 = (float)local_98._0_4_;
      } while (uVar10 != 0);
      uVar10 = (int)local_68 + 1;
      local_68 = (ulong)uVar10;
    } while (uVar10 != (uint)local_70);
  }
  local_88 = 1.0 / local_88;
  fVar23 = ABS(fStack_dc * local_88);
  uVar10 = (uint)(fStack_dc * local_88) >> 0x10 & 0x8000;
  if ((uint)fVar23 < 0x38800000) {
    if ((0x33000000 < (uint)fVar23) &&
       (uVar9 = (uint)fVar23 & 0x7fffff | 0x800000, cVar7 = (char)((uint)fVar23 >> 0x17),
       uVar10 = uVar10 | uVar9 >> (0x7eU - cVar7 & 0x1f),
       0x80000000 < uVar9 << (cVar7 + 0xa2U & 0x1f))) {
      uVar10 = uVar10 + 1;
    }
  }
  else if ((uint)fVar23 < 0x7f800000) {
    if ((uint)fVar23 < 0x477ff000) {
      uVar10 = (int)fVar23 + 0x8000fff + (uint)(((uint)fVar23 >> 0xd & 1) != 0) >> 0xd | uVar10;
    }
    else {
      uVar10 = uVar10 | 0x7c00;
    }
  }
  else {
    uVar10 = uVar10 | 0x7c00;
    if (fVar23 != INFINITY) {
      uVar9 = (uint)fVar23 >> 0xd & 0x3ff;
      uVar10 = uVar10 | uVar9 | (uint)(uVar9 == 0);
    }
  }
  fVar23 = ABS(fStack_e0 * local_88);
  uVar9 = (uint)(fStack_e0 * local_88) >> 0x10 & 0x8000;
  if ((uint)fVar23 < 0x38800000) {
    if ((0x33000000 < (uint)fVar23) &&
       (uVar13 = (uint)fVar23 & 0x7fffff | 0x800000, cVar7 = (char)((uint)fVar23 >> 0x17),
       uVar9 = uVar9 | uVar13 >> (0x7eU - cVar7 & 0x1f),
       0x80000000 < uVar13 << (cVar7 + 0xa2U & 0x1f))) {
      uVar9 = uVar9 + 1;
    }
  }
  else if ((uint)fVar23 < 0x7f800000) {
    if ((uint)fVar23 < 0x477ff000) {
      uVar9 = (int)fVar23 + 0x8000fff + (uint)(((uint)fVar23 >> 0xd & 1) != 0) >> 0xd | uVar9;
    }
    else {
      uVar9 = uVar9 | 0x7c00;
    }
  }
  else {
    uVar9 = uVar9 | 0x7c00;
    if (fVar23 != INFINITY) {
      uVar13 = (uint)fVar23 >> 0xd & 0x3ff;
      uVar9 = uVar9 | uVar13 | (uint)(uVar13 == 0);
    }
  }
  fVar23 = ABS(fStack_e4 * local_88);
  uVar13 = (uint)(fStack_e4 * local_88) >> 0x10 & 0x8000;
  if ((uint)fVar23 < 0x38800000) {
    if ((0x33000000 < (uint)fVar23) &&
       (uVar14 = (uint)fVar23 & 0x7fffff | 0x800000, cVar7 = (char)((uint)fVar23 >> 0x17),
       uVar13 = uVar13 | uVar14 >> (0x7eU - cVar7 & 0x1f),
       0x80000000 < uVar14 << (cVar7 + 0xa2U & 0x1f))) {
      uVar13 = uVar13 + 1;
    }
  }
  else if ((uint)fVar23 < 0x7f800000) {
    if ((uint)fVar23 < 0x477ff000) {
      uVar13 = (int)fVar23 + 0x8000fff + (uint)(((uint)fVar23 >> 0xd & 1) != 0) >> 0xd | uVar13;
    }
    else {
      uVar13 = uVar13 | 0x7c00;
    }
  }
  else {
    uVar13 = uVar13 | 0x7c00;
    if (fVar23 != INFINITY) {
      uVar14 = (uint)fVar23 >> 0xd & 0x3ff;
      uVar13 = uVar13 | uVar14 | (uint)(uVar14 == 0);
    }
  }
  fVar23 = ABS(fVar22 * local_88);
  uVar14 = (uint)(fVar22 * local_88) >> 0x10 & 0x8000;
  if ((uint)fVar23 < 0x38800000) {
    if ((0x33000000 < (uint)fVar23) &&
       (uVar15 = (uint)fVar23 & 0x7fffff | 0x800000, cVar7 = (char)((uint)fVar23 >> 0x17),
       uVar14 = uVar14 | uVar15 >> (0x7eU - cVar7 & 0x1f),
       0x80000000 < uVar15 << (cVar7 + 0xa2U & 0x1f))) {
      uVar14 = uVar14 + 1;
    }
  }
  else if ((uint)fVar23 < 0x7f800000) {
    if ((uint)fVar23 < 0x477ff000) {
      uVar14 = (int)fVar23 + 0x8000fff + (uint)(((uint)fVar23 >> 0xd & 1) != 0) >> 0xd | uVar14;
    }
    else {
      uVar14 = uVar14 | 0x7c00;
    }
  }
  else {
    uVar14 = uVar14 | 0x7c00;
    if (fVar23 != INFINITY) {
      uVar15 = (uint)fVar23 >> 0xd & 0x3ff;
      uVar14 = uVar14 | uVar15 | (uint)(uVar15 == 0);
    }
  }
  return (Rgba)((ulong)(uVar10 & 0xffff) |
               (ulong)(uVar9 << 0x10) |
               (ulong)(uVar13 & 0xffff) << 0x20 | (ulong)(uVar14 & 0xffff) << 0x30);
}

Assistant:

Rgba
EnvmapImage::filteredLookup (V3f d, float r, int n) const
{
    //
    // Filtered environment map lookup: Take n by n point samples
    // from the environment map, clustered around direction d, and
    // combine the samples with a tent filter.
    //

    //
    // Depending on the type of map, pick an appropriate function
    // to convert 3D directions to 2D pixel poitions.
    //

    V2f (*dirToPos) (const Box2i&, const V3f&);

    if (_type == ENVMAP_LATLONG)
        dirToPos = dirToPosLatLong;
    else
        dirToPos = dirToPosCube;

    //
    // Pick two vectors, dx and dy, of length r, that are orthogonal
    // to the lookup direction, d, and to each other.
    //

    d.normalize ();
    V3f dx, dy;

    if (abs (d.x) > 0.707f)
        dx = (d % V3f (0, 1, 0)).normalized () * r;
    else
        dx = (d % V3f (1, 0, 0)).normalized () * r;

    dy = (d % dx).normalized () * r;

    //
    // Take n by n point samples from the map, and add them up.
    // The directions for the point samples are all within the pyramid
    // defined by the vectors d-dy-dx, d-dy+dx, d+dy-dx, d+dy+dx.
    //

    float wt = 0;

    float cr = 0;
    float cg = 0;
    float cb = 0;
    float ca = 0;

    for (int y = 0; y < n; ++y)
    {
        float ry = float (2 * y + 2) / float (n + 1) - 1;
        float wy = 1 - abs (ry);
        V3f   ddy (ry * dy);

        for (int x = 0; x < n; ++x)
        {
            float rx = float (2 * x + 2) / float (n + 1) - 1;
            float wx = 1 - abs (rx);
            V3f   ddx (rx * dx);

            Rgba s = sample (dirToPos (_dataWindow, d + ddx + ddy));

            float w = wx * wy;
            wt += w;

            cr += s.r * w;
            cg += s.g * w;
            cb += s.b * w;
            ca += s.a * w;
        }
    }

    wt = 1 / wt;

    Rgba c;

    c.r = cr * wt;
    c.g = cg * wt;
    c.b = cb * wt;
    c.a = ca * wt;

    return c;
}